

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::
elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
::format(elapsed_formatter<spdlog::details::null_scoped_padder,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         *this,log_msg *msg,tm *param_2,memory_buf_t *dest)

{
  long lVar1;
  char *__src;
  unsigned_long_long uVar2;
  unsigned_long_long value;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar3;
  format_int fStack_48;
  
  lVar1 = (msg->time).__d.__r;
  uVar2 = lVar1 - (this->last_message_time_).__d.__r;
  value = 0;
  if (0 < (long)uVar2) {
    value = uVar2;
  }
  (this->last_message_time_).__d.__r = lVar1;
  __src = fmt::v6::format_int::format_decimal(&fStack_48,value);
  __n = (long)(fStack_48.buffer_ + 0x15) - (long)__src;
  uVar3 = (dest->super_buffer<char>).size_ + __n;
  fStack_48.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar3) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar3);
  }
  if (fStack_48.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
  }
  (dest->super_buffer<char>).size_ = uVar3;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto delta = (std::max)(msg.time - last_message_time_, log_clock::duration::zero());
        auto delta_units = std::chrono::duration_cast<DurationUnits>(delta);
        last_message_time_ = msg.time;
        auto delta_count = static_cast<size_t>(delta_units.count());
        auto n_digits = static_cast<size_t>(fmt_helper::count_digits(delta_count));
        ScopedPadder p(n_digits, padinfo_, dest);
        fmt_helper::append_int(delta_count, dest);
    }